

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RiemannR.cpp
# Opt level: O2

longdouble *
anon_unknown.dwarf_161a5f::RiemannR<long_double>(longdouble *__return_storage_ptr__,longdouble x)

{
  longdouble *in_RAX;
  ulong uVar1;
  longdouble *plVar2;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  
  if ((longdouble)1e-05 <= x) {
    uVar1 = 1;
    plVar2 = (longdouble *)((anonymous_namespace)::zeta + 0x20);
    in_RAX = (longdouble *)logl();
    lVar6 = (longdouble)1;
    lVar4 = lVar6;
    do {
      if (uVar1 == 1000) {
        return in_RAX;
      }
      lVar3 = (longdouble)(int)uVar1;
      lVar6 = (in_ST0 / lVar3) * lVar6;
      if (uVar1 < 0x7f) {
        lVar3 = *plVar2 * lVar3;
      }
      lVar3 = lVar6 / lVar3 + lVar4;
      lVar5 = lVar3 - lVar4;
      plVar2 = plVar2 + 1;
      uVar1 = uVar1 + 1;
      lVar4 = lVar3;
    } while ((longdouble)1.0842022e-19 < ABS(lVar5));
  }
  return in_RAX;
}

Assistant:

T RiemannR(T x)
{
  if (x < T(1e-5))
    return 0;

  T epsilon = pstd::numeric_limits<T>::epsilon();
  T sum = 1;
  T term = 1;
  T logx = std::log(x);

  // The condition k < ITERS is required in case the computation
  // does not converge. This happened on Linux i386 where
  // the precision of the libc math functions is very limited.
  for (unsigned k = 1; k < 1000; k++)
  {
    term *= logx / k;
    T old_sum = sum;

    if (k + 1 < zeta.size())
      sum += term / (T(zeta[k + 1]) * k);
    else
      // For k >= 127, approximate zeta(k + 1) by 1
      sum += term / k;

    // Not converging anymore
    if (std::abs(sum - old_sum) <= epsilon)
      break;
  }

  return sum;
}